

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O0

void __thiscall FBX::Decoder::Decoder(Decoder *this,string *path)

{
  string *path_local;
  Decoder *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  Stream::Stream(&this->stream,path);
  this->version = 0;
  this->blockLength = 0;
  std::vector<char,_std::allocator<char>_>::vector(&this->blockData);
  this->isuInt32 = true;
  return;
}

Assistant:

Decoder::Decoder(const std::string &path) : path(path), stream(path) {}